

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::Maybe<kj::AutoCloseFd>_> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>(AsyncStreamFd *this)

{
  int osErrorNumber;
  ssize_t sVar1;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar2;
  _func_int **in_RSI;
  Promise<kj::Maybe<kj::AutoCloseFd>_> PVar3;
  Fault f;
  char c;
  undefined1 local_c8 [28];
  NullableValue<kj::AutoCloseFd> local_ac;
  anon_union_24_2_c6a5a82d anon_var_2;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  iovec local_68;
  msghdr msg;
  
  msg.msg_flags = 0;
  msg._52_4_ = 0;
  msg.msg_name = (void *)0x0;
  msg.msg_namelen = 0;
  msg._12_4_ = 0;
  local_68.iov_base = &c;
  msg.msg_iov = &local_68;
  local_68.iov_len = 1;
  msg.msg_iovlen = 1;
  msg.msg_control = &anon_var_2;
  msg.msg_controllen = 0x18;
  do {
    sVar1 = recvmsg(*(int *)(in_RSI + 2),(msghdr *)&msg,0x40000000);
    if (-1 < sVar1) {
      if (sVar1 == 0) {
        local_ac.isSet = false;
        Promise<kj::Maybe<kj::AutoCloseFd>_>::Promise
                  ((Promise<kj::Maybe<kj::AutoCloseFd>_> *)this,
                   (FixVoid<kj::Maybe<kj::AutoCloseFd>_> *)&local_ac);
        kj::_::NullableValue<kj::AutoCloseFd>::~NullableValue(&local_ac);
        pPVar2 = extraout_RDX_01;
      }
      else {
        if (msg.msg_controllen < 0x10) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1da,FAILED,"msg.msg_controllen >= sizeof(cmsg)",
                     "\"expected to receive FD over socket; received data instead\"",
                     (char (*) [58])"expected to receive FD over socket; received data instead");
          kj::_::Debug::Fault::fatal(&f);
        }
        if (anon_var_2.cmsg.cmsg_level != 1) {
          kj::_::Debug::Fault::Fault
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1dd,FAILED,"cmsg.cmsg_level == SOL_SOCKET","");
          kj::_::Debug::Fault::fatal(&f);
        }
        if (anon_var_2.cmsg.cmsg_type != 1) {
          kj::_::Debug::Fault::Fault
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1de,FAILED,"cmsg.cmsg_type == SCM_RIGHTS","");
          kj::_::Debug::Fault::fatal(&f);
        }
        if (anon_var_2.cmsg.cmsg_len != 0x14) {
          kj::_::Debug::Fault::Fault
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1df,FAILED,"cmsg.cmsg_len == CMSG_LEN(sizeof(int))","");
          kj::_::Debug::Fault::fatal(&f);
        }
        f.exception._0_4_ = anon_var_2._16_4_;
        UnwindDetector::UnwindDetector((UnwindDetector *)((long)&f.exception + 4));
        kj::_::NullableValue<kj::AutoCloseFd>::NullableValue
                  ((NullableValue<kj::AutoCloseFd> *)(local_c8 + 0x10),(AutoCloseFd *)&f);
        Promise<kj::Maybe<kj::AutoCloseFd>_>::Promise
                  ((Promise<kj::Maybe<kj::AutoCloseFd>_> *)this,
                   (FixVoid<kj::Maybe<kj::AutoCloseFd>_> *)(local_c8 + 0x10));
        kj::_::NullableValue<kj::AutoCloseFd>::~NullableValue
                  ((NullableValue<kj::AutoCloseFd> *)(local_c8 + 0x10));
        AutoCloseFd::~AutoCloseFd((AutoCloseFd *)&f);
        pPVar2 = extraout_RDX_00;
      }
      goto LAB_004997ad;
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x1d1,osErrorNumber,"n = recvmsg(fd, &msg, recvmsgFlags)","");
    kj::_::Debug::Fault::fatal(&f);
  }
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_c8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_c8,
             kj::_::
             TransformPromiseNode<kj::Promise<kj::Maybe<kj::AutoCloseFd>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:467:50),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067bf80;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
  f.exception = (Exception *)
                &kj::_::
                 HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::Maybe<kj::AutoCloseFd>>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>()::{lambda()#2},kj::_::PropagateException>>
                 ::instance;
  kj::_::maybeChain<kj::Maybe<kj::AutoCloseFd>>
            (&local_88,(Promise<kj::Maybe<kj::AutoCloseFd>_> *)&f);
  pPVar2 = local_88.ptr;
  local_78.disposer = local_88.disposer;
  local_88.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_88);
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)local_88.disposer;
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)pPVar2;
  local_78.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_78);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_c8);
  pPVar2 = extraout_RDX;
LAB_004997ad:
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::AutoCloseFd>_>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<T>> tryReceiveFdImpl() {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct iovec iov;
    memset(&iov, 0, sizeof(iov));
    char c;
    iov.iov_base = &c;
    iov.iov_len = 1;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    // Allocate space to receive a cmsg.
    union {
      struct cmsghdr cmsg;
      char cmsgSpace[CMSG_SPACE(sizeof(int))];
    };
    msg.msg_control = &cmsg;
    msg.msg_controllen = sizeof(cmsgSpace);

#ifdef MSG_CMSG_CLOEXEC
    int recvmsgFlags = MSG_CMSG_CLOEXEC;
#else
    int recvmsgFlags = 0;
#endif

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(fd, &msg, recvmsgFlags));
    if (n < 0) {
      return observer.whenBecomesReadable().then([this]() {
        return tryReceiveFdImpl<T>();
      });
    } else if (n == 0) {
      return kj::Maybe<T>(nullptr);
    } else {
      KJ_REQUIRE(msg.msg_controllen >= sizeof(cmsg),
          "expected to receive FD over socket; received data instead");

      // We expect an SCM_RIGHTS message with a single FD.
      KJ_REQUIRE(cmsg.cmsg_level == SOL_SOCKET);
      KJ_REQUIRE(cmsg.cmsg_type == SCM_RIGHTS);
      KJ_REQUIRE(cmsg.cmsg_len == CMSG_LEN(sizeof(int)));

      int receivedFd;
      memcpy(&receivedFd, CMSG_DATA(&cmsg), sizeof(receivedFd));
      return kj::Maybe<T>(wrapFd(receivedFd, (T*)nullptr));
    }
  }